

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

ProjectionArrayBuffer * Js::ProjectionArrayBuffer::Create(uint32 length,DynamicType *type)

{
  ScriptContext *this;
  Recycler *pRVar1;
  ProjectionArrayBuffer *this_00;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler;
  DynamicType *type_local;
  uint32 length_local;
  
  recycler = (Recycler *)type;
  type_local._4_4_ = length;
  this = Js::Type::GetScriptContext(&type->super_Type);
  local_20 = ScriptContext::GetRecycler(this);
  Memory::Recycler::AddExternalMemoryUsage(local_20,(ulong)type_local._4_4_);
  pRVar1 = local_20;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
             ,0x4a1);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_00 = (ProjectionArrayBuffer *)new<Memory::Recycler>(0x48,pRVar1,0x4642b0);
  ProjectionArrayBuffer(this_00,type_local._4_4_,(DynamicType *)recycler);
  return this_00;
}

Assistant:

ProjectionArrayBuffer* ProjectionArrayBuffer::Create(uint32 length, DynamicType * type)
    {
        Recycler* recycler = type->GetScriptContext()->GetRecycler();
        recycler->AddExternalMemoryUsage(length);
        return RecyclerNewFinalized(recycler, ProjectionArrayBuffer, length, type);
    }